

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ecmult_pre_g(void)

{
  int iVar1;
  size_t i;
  secp256k1_ge g;
  secp256k1_gej gj;
  secp256k1_ge_storage gs;
  size_t in_stack_00000158;
  secp256k1_ge_storage *in_stack_00000160;
  secp256k1_ge *in_stack_fffffffffffffeb8;
  secp256k1_gej *a;
  secp256k1_gej *in_stack_fffffffffffffec0;
  secp256k1_gej *in_stack_ffffffffffffff18;
  secp256k1_ge *in_stack_ffffffffffffff20;
  undefined1 local_40 [64];
  
  test_pre_g_table(in_stack_00000160,in_stack_00000158);
  test_pre_g_table(in_stack_00000160,in_stack_00000158);
  secp256k1_ge_to_storage
            ((secp256k1_ge_storage *)in_stack_ffffffffffffff20,
             (secp256k1_ge *)in_stack_ffffffffffffff18);
  iVar1 = secp256k1_memcmp_var(local_40,secp256k1_pre_g,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1130,
            "test condition failed: secp256k1_memcmp_var(&gs, &secp256k1_pre_g[0], sizeof(gs)) == 0"
           );
    abort();
  }
  secp256k1_gej_set_ge(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  for (a = (secp256k1_gej *)0x0; a < (secp256k1_gej *)0x80;
      a = (secp256k1_gej *)((long)(a->x).n + 1)) {
    secp256k1_gej_double_var(in_stack_fffffffffffffec0,a,(secp256k1_fe *)0x116c03);
  }
  secp256k1_ge_set_gej(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  secp256k1_ge_to_storage
            ((secp256k1_ge_storage *)in_stack_ffffffffffffff20,
             (secp256k1_ge *)in_stack_ffffffffffffff18);
  iVar1 = secp256k1_memcmp_var(local_40,secp256k1_pre_g_128,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1139,
            "test condition failed: secp256k1_memcmp_var(&gs, &secp256k1_pre_g_128[0], sizeof(gs)) == 0"
           );
    abort();
  }
  return;
}

Assistant:

static void run_ecmult_pre_g(void) {
    secp256k1_ge_storage gs;
    secp256k1_gej gj;
    secp256k1_ge g;
    size_t i;

    /* Check that the pre_g and pre_g_128 tables are consistent. */
    test_pre_g_table(secp256k1_pre_g, ECMULT_TABLE_SIZE(WINDOW_G));
    test_pre_g_table(secp256k1_pre_g_128, ECMULT_TABLE_SIZE(WINDOW_G));

    /* Check the first entry from the pre_g table. */
    secp256k1_ge_to_storage(&gs, &secp256k1_ge_const_g);
    CHECK(secp256k1_memcmp_var(&gs, &secp256k1_pre_g[0], sizeof(gs)) == 0);

    /* Check the first entry from the pre_g_128 table. */
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    for (i = 0; i < 128; ++i) {
      secp256k1_gej_double_var(&gj, &gj, NULL);
    }
    secp256k1_ge_set_gej(&g, &gj);
    secp256k1_ge_to_storage(&gs, &g);
    CHECK(secp256k1_memcmp_var(&gs, &secp256k1_pre_g_128[0], sizeof(gs)) == 0);
}